

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O0

bool __thiscall
crnlib::mipmapped_texture::read_from_stream
          (mipmapped_texture *this,data_stream_serializer *serializer,format file_format)

{
  data_stream *pdVar1;
  dynamic_string *this_00;
  format in_EDX;
  mipmapped_texture *in_RSI;
  mipmapped_texture *in_RDI;
  bool success;
  data_stream_serializer *in_stack_00000260;
  mipmapped_texture *in_stack_00000268;
  dynamic_string *in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffd0;
  format in_stack_ffffffffffffffd4;
  uint in_stack_ffffffffffffffe0;
  byte bVar2;
  format fVar3;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  bool bVar4;
  
  clear((mipmapped_texture *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  pdVar1 = data_stream_serializer::get_stream((data_stream_serializer *)in_RSI);
  if (pdVar1 == (data_stream *)0x0) {
    set_last_error((mipmapped_texture *)
                   CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   (char *)in_stack_ffffffffffffffc8);
    bVar4 = false;
  }
  else {
    if (in_EDX == cFormatInvalid) {
      this_00 = data_stream_serializer::get_name
                          ((data_stream_serializer *)
                           CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
      dynamic_string::get_ptr(this_00);
      in_EDX = texture_file_types::determine_file_format
                         ((char *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
    }
    if (in_EDX == cFormatInvalid) {
      set_last_error((mipmapped_texture *)
                     CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     (char *)in_stack_ffffffffffffffc8);
      bVar4 = false;
    }
    else {
      set_last_error((mipmapped_texture *)
                     CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     (char *)in_stack_ffffffffffffffc8);
      in_stack_ffffffffffffffe0 = in_stack_ffffffffffffffe0 & 0xffffff;
      bVar4 = texture_file_types::supports_mipmaps(in_EDX);
      fVar3 = in_EDX;
      if (bVar4) {
        if (in_EDX == cFormatDDS) {
          bVar4 = read_dds(in_RDI,(data_stream_serializer *)(ulong)in_stack_ffffffffffffffd0);
          in_stack_ffffffffffffffe0 = (uint)bVar4 << 0x18;
        }
        else if (in_EDX == cFormatCRN) {
          bVar4 = read_crn(this,serializer);
          in_stack_ffffffffffffffe0 = (uint)bVar4 << 0x18;
        }
        else if (in_EDX == cFormatKTX) {
          bVar4 = read_ktx(in_stack_00000268,in_stack_00000260);
          in_stack_ffffffffffffffe0 = (uint)bVar4 << 0x18;
        }
      }
      else {
        bVar4 = read_regular_image(in_RSI,(data_stream_serializer *)
                                          CONCAT44(in_EDX,in_stack_ffffffffffffffe0));
        in_stack_ffffffffffffffe0 = (uint)bVar4 << 0x18;
        in_EDX = in_stack_ffffffffffffffd4;
      }
      bVar2 = (byte)(in_stack_ffffffffffffffe0 >> 0x18);
      if ((in_stack_ffffffffffffffe0 & 0x1000000) != 0) {
        in_RDI->m_source_file_type = fVar3;
        data_stream_serializer::get_name
                  ((data_stream_serializer *)CONCAT44(in_EDX,in_stack_ffffffffffffffd0));
        set_name((mipmapped_texture *)CONCAT44(in_EDX,in_stack_ffffffffffffffd0),
                 in_stack_ffffffffffffffc8);
        clear_last_error((mipmapped_texture *)0x1720be);
      }
      bVar4 = (bool)(bVar2 & 1);
    }
  }
  return bVar4;
}

Assistant:

bool mipmapped_texture::read_from_stream(data_stream_serializer& serializer, texture_file_types::format file_format) {
  clear();

  if (!serializer.get_stream()) {
    set_last_error("Invalid stream");
    return false;
  }

  if (file_format == texture_file_types::cFormatInvalid)
    file_format = texture_file_types::determine_file_format(serializer.get_name().get_ptr());

  if (file_format == texture_file_types::cFormatInvalid) {
    set_last_error("Unsupported file format");
    return false;
  }

  set_last_error("Image file load failed");

  bool success = false;

  if (!texture_file_types::supports_mipmaps(file_format)) {
    success = read_regular_image(serializer);
  } else {
    switch (file_format) {
      case texture_file_types::cFormatDDS: {
        success = read_dds(serializer);
        break;
      }
      case texture_file_types::cFormatCRN: {
        success = read_crn(serializer);
        break;
      }
      case texture_file_types::cFormatKTX: {
        success = read_ktx(serializer);
        break;
      }
      default: {
        CRNLIB_ASSERT(0);
        break;
      }
    }
  }

  if (success) {
    CRNLIB_ASSERT(check());

    m_source_file_type = file_format;
    set_name(serializer.get_name());
    clear_last_error();
  }

  return success;
}